

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# updaterevision.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  int *piVar7;
  char vertag [128];
  char lastlog [128];
  char lasthash [128];
  undefined8 uStack_1b0;
  ulong local_1a8;
  char acStack_1a0 [119];
  char cStack_129;
  undefined2 local_128;
  undefined1 local_126;
  char acStack_a9 [4];
  char local_a5 [125];
  
  local_1a8 = local_1a8 & 0xffffffffffffff00;
  local_128 = local_128 & 0xff00;
  if (argc != 2) {
    uStack_1b0 = 0x1013cc;
    main_cold_1();
    return 1;
  }
  uStack_1b0 = 0x101252;
  pFVar3 = popen("git describe --tags && git log -1 --format=%ai*%H","r");
  bVar1 = true;
  if (pFVar3 == (FILE *)0x0) {
LAB_001013d8:
    pFVar3 = _stderr;
    uStack_1b0 = 0x1013e7;
    piVar7 = __errno_location();
    uStack_1b0 = 0x1013ee;
    pcVar4 = strerror(*piVar7);
    uStack_1b0 = 0x101402;
    fprintf(pFVar3,"Failed to get commit info: %s\n",pcVar4);
    local_1a8._0_1_ = '<';
    local_1a8._1_1_ = 'u';
    local_1a8._2_1_ = 'n';
    local_1a8._3_1_ = 'k';
    local_1a8._4_1_ = 'n';
    local_1a8._5_1_ = 'o';
    local_1a8._6_1_ = 'w';
    local_1a8._7_1_ = 'n';
    builtin_strncpy(acStack_1a0," version>",10);
    pcVar4 = (char *)((long)&local_128 + 1);
    local_128 = 0x3000;
    local_126 = 0;
    uStack_1b0 = 0x10143c;
    pFVar3 = fopen(argv[1],"r");
    if (pFVar3 != (FILE *)0x0) {
      if (bVar1) {
        uStack_1b0 = 0x101455;
        fclose(pFVar3);
        return 0;
      }
LAB_00101327:
      uStack_1b0 = 0x10133f;
      pcVar6 = fgets(acStack_a9 + 1,0x80,pFVar3);
      if (pcVar6 == acStack_a9 + 1) {
        if (acStack_a9[1] != '\0') {
          uStack_1b0 = 0x101368;
          sVar5 = strlen(acStack_a9 + 1);
          if (acStack_a9[sVar5] == '\n') {
            acStack_a9[sVar5] = '\0';
          }
        }
        uStack_1b0 = 0x10138a;
        iVar2 = strcmp(pcVar4,local_a5);
        uStack_1b0 = 0x101394;
        fclose(pFVar3);
        if (iVar2 == 0) {
          pcVar4 = argv[1];
          pcVar6 = "%s is up to date at commit %s.\n";
          goto LAB_001014cd;
        }
      }
      else {
        uStack_1b0 = 0x10134c;
        fclose(pFVar3);
      }
    }
  }
  else {
    uStack_1b0 = 0x101274;
    pcVar4 = fgets((char *)&local_1a8,0x80,pFVar3);
    if ((ulong *)pcVar4 != &local_1a8) {
LAB_001013ba:
      uStack_1b0 = 0x1013c2;
      pclose(pFVar3);
      goto LAB_001013d8;
    }
    uStack_1b0 = 0x101295;
    pcVar4 = fgets((char *)&local_128,0x80,pFVar3);
    if (pcVar4 != (char *)&local_128) goto LAB_001013ba;
    if ((char)local_1a8 != '\0') {
      uStack_1b0 = 0x1012ac;
      sVar5 = strlen((char *)&local_1a8);
      if (*(char *)((long)&uStack_1b0 + sVar5 + 7) == '\n') {
        *(undefined1 *)((long)&uStack_1b0 + sVar5 + 7) = 0;
      }
    }
    if ((char)local_128 != '\0') {
      uStack_1b0 = 0x1012cf;
      sVar5 = strlen((char *)&local_128);
      if ((&cStack_129)[sVar5] == '\n') {
        (&cStack_129)[sVar5] = '\0';
      }
    }
    uStack_1b0 = 0x1012e3;
    pclose(pFVar3);
    uStack_1b0 = 0x1012f5;
    pcVar4 = strchr((char *)&local_128,0x2a);
    if (pcVar4 == (char *)0x0) {
      bVar1 = false;
      goto LAB_001013d8;
    }
    *pcVar4 = '\0';
    pcVar4 = pcVar4 + 1;
    uStack_1b0 = 0x10131b;
    pFVar3 = fopen(argv[1],"r");
    if (pFVar3 != (FILE *)0x0) goto LAB_00101327;
  }
  uStack_1b0 = 0x101468;
  pFVar3 = fopen(argv[1],"w");
  if (pFVar3 == (FILE *)0x0) {
    return 1;
  }
  uStack_1b0 = 0x1014ae;
  fprintf(pFVar3,
          "// %s\n//\n// This file was automatically generated by the\n// updaterevision tool. Do not edit by hand.\n\n#define GIT_DESCRIPTION \"%s\"\n#define GIT_HASH \"%s\"\n#define GIT_TIME \"%s\"\n"
          ,pcVar4,&local_1a8,pcVar4,&local_128);
  uStack_1b0 = 0x1014b6;
  fclose(pFVar3);
  pcVar4 = argv[1];
  pcVar6 = "%s updated to commit %s.\n";
LAB_001014cd:
  uStack_1b0 = 0x1014d4;
  fprintf(_stderr,pcVar6,pcVar4,&local_1a8);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	char vertag[128], lastlog[128], lasthash[128], *hash = NULL;
	FILE *stream = NULL;
	int gotrev = 0, needupdate = 1;

	vertag[0] = '\0';
	lastlog[0] = '\0';

	if (argc != 2)
	{
		fprintf(stderr, "Usage: %s <path to gitinfo.h>\n", argv[0]);
		return 1;
	}

	// Use git describe --tags to get a version string. If we are sitting directly
	// on a tag, it returns that tag. Otherwise it returns <most recent tag>-<number of
	// commits since the tag>-<short hash>.
	// Use git log to get the time of the latest commit in ISO 8601 format and its full hash.
	stream = popen("git describe --tags && git log -1 --format=%ai*%H", "r");

	if (NULL != stream)
	{
		if (fgets(vertag, sizeof vertag, stream) == vertag &&
			fgets(lastlog, sizeof lastlog, stream) == lastlog)
		{
			stripnl(vertag);
			stripnl(lastlog);
			gotrev = 1;
		}

		pclose(stream);
	}

	if (gotrev)
	{
		hash = strchr(lastlog, '*');
		if (hash != NULL)
		{
			*hash = '\0';
			hash++;
		}
	}
	if (hash == NULL)
	{
		fprintf(stderr, "Failed to get commit info: %s\n", strerror(errno));
		strcpy(vertag, "<unknown version>");
		lastlog[0] = '\0';
		lastlog[1] = '0';
		lastlog[2] = '\0';
		hash = lastlog + 1;
	}

	stream = fopen (argv[1], "r");
	if (stream != NULL)
	{
		if (!gotrev)
		{ // If we didn't get a revision but the file does exist, leave it alone.
			fclose (stream);
			return 0;
		}
		// Read the revision that's in this file already. If it's the same as
		// what we've got, then we don't need to modify it and can avoid rebuilding
		// dependant files.
		if (fgets(lasthash, sizeof lasthash, stream) == lasthash)
		{
			stripnl(lasthash);
			if (strcmp(hash, lasthash + 3) == 0)
			{
				needupdate = 0;
			}
		}
		fclose (stream);
	}

	if (needupdate)
	{
		stream = fopen (argv[1], "w");
		if (stream == NULL)
		{
			return 1;
		}
		fprintf(stream,
"// %s\n"
"//\n"
"// This file was automatically generated by the\n"
"// updaterevision tool. Do not edit by hand.\n"
"\n"
"#define GIT_DESCRIPTION \"%s\"\n"
"#define GIT_HASH \"%s\"\n"
"#define GIT_TIME \"%s\"\n",
			hash, vertag, hash, lastlog);
		fclose(stream);
		fprintf(stderr, "%s updated to commit %s.\n", argv[1], vertag);
	}
	else
	{
		fprintf (stderr, "%s is up to date at commit %s.\n", argv[1], vertag);
	}

	return 0;
}